

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall edition_unittest::TestVerifyInt32::~TestVerifyInt32(TestVerifyInt32 *this)

{
  TestVerifyInt32 *this_local;
  
  ~TestVerifyInt32(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TestVerifyInt32::~TestVerifyInt32() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestVerifyInt32)
  SharedDtor(*this);
}